

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexCompileTime.cpp
# Opt level: O0

void __thiscall UnifiedRegex::AltNode::AnnotatePass4(AltNode *this,Compiler *compiler)

{
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  AltNode *pAVar4;
  bool bVar5;
  bool bVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  ThreadContext *this_00;
  undefined4 *puVar10;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar11;
  CharSet<char16_t> *this_01;
  RuntimeCharTrie *this_02;
  TrackAllocData local_128;
  AltNode *local_100;
  AltNode *curr_6;
  CharTrie trie;
  AltNode *pAStack_d8;
  uint numAlts;
  AltNode *curr_5;
  undefined1 local_c8 [7];
  bool fires_2;
  CharSet<char16_t> unionSet;
  AltNode *curr_4;
  int local_90;
  uint totalChars_1;
  int numNonEmpty;
  bool allCompact_1;
  bool allSimpleOneChar_1;
  bool fires_1;
  AltNode *curr_3;
  int local_78;
  uint totalChars;
  int numItems;
  bool allSimpleOneChar;
  bool allCompact;
  bool fires;
  AltNode *curr_2;
  AltNode *curr_1;
  TrackAllocData local_50;
  AltNode *local_28;
  AltNode *curr;
  Compiler *pCStack_18;
  bool simplified;
  Compiler *compiler_local;
  AltNode *this_local;
  
  pCStack_18 = compiler;
  compiler_local = (Compiler *)this;
  this_00 = Js::ScriptContext::GetThreadContext(compiler->scriptContext);
  ThreadContext::ProbeStackNoDispose(this_00,0x6000,pCStack_18->scriptContext,(PVOID)0x0);
  curr._7_1_ = '\0';
  if (((*(uint *)&(this->super_Node).field_0xc >> 2 & 1) != 0) &&
     (pAVar4 = this, (*(uint *)&(this->super_Node).field_0xc >> 1 & 1) != 0)) {
    while (local_28 = pAVar4, local_28 != (AltNode *)0x0) {
      if (((*(uint *)&local_28->head->field_0xc >> 1 & 1) != 0) &&
         (local_28->tail != (AltNode *)0x0)) {
        local_28->tail = (AltNode *)0x0;
        curr._7_1_ = '\x01';
        break;
      }
      pAVar4 = local_28->tail;
    }
  }
  if (curr._7_1_ != '\0') {
    if ((*(uint *)&(this->super_Node).field_0xc & 1) != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar10 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                         ,0x8e9,"(!isFirstExact)","!isFirstExact");
      if (!bVar5) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar10 = 0;
    }
    pAVar11 = &pCStack_18->ctAllocator->
               super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_50,(type_info *)&CharSet<char16_t>::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
               ,0x8ee);
    pAVar11 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
              TrackAllocInfo(pAVar11,&local_50);
    this_01 = (CharSet<char16_t> *)
              new<Memory::ArenaAllocator>(0x28,(ArenaAllocator *)pAVar11,0x3f67b0);
    CharSet<char16_t>::CharSet(this_01);
    (this->super_Node).firstSet = this_01;
    for (curr_2 = this; curr_2 != (AltNode *)0x0; curr_2 = curr_2->tail) {
      CharSet<char16_t>::UnionInPlace
                ((this->super_Node).firstSet,pCStack_18->ctAllocator,curr_2->head->firstSet);
    }
  }
  *(uint *)&(this->super_Node).field_0xc =
       *(uint *)&(this->super_Node).field_0xc & 0xfffffdff | 0x200;
  for (_numItems = this; _numItems != (AltNode *)0x0; _numItems = _numItems->tail) {
    (*_numItems->head->_vptr_Node[10])(_numItems->head,pCStack_18);
    if ((*(uint *)&_numItems->head->field_0xc >> 9 & 1) == 0) {
      *(uint *)&(this->super_Node).field_0xc = *(uint *)&(this->super_Node).field_0xc & 0xfffffdff;
    }
  }
  bVar5 = true;
  bVar3 = true;
  bVar2 = true;
  local_78 = 0;
  curr_3._4_4_ = 0;
  for (_numNonEmpty = this; _numNonEmpty != (AltNode *)0x0; _numNonEmpty = _numNonEmpty->tail) {
    bVar6 = CountDomain::CouldMatchEmpty(&_numNonEmpty->head->thisConsumes);
    if (bVar6) {
      bVar5 = false;
      break;
    }
    local_78 = local_78 + 1;
    bVar6 = CharSet<char16_t>::IsCompact(_numNonEmpty->head->firstSet);
    if (!bVar6) {
      bVar3 = false;
    }
    bVar6 = Node::IsSimpleOneChar(_numNonEmpty->head);
    if (!bVar6) {
      bVar2 = false;
    }
    uVar7 = CharSet<char16_t>::Count(_numNonEmpty->head->firstSet);
    curr_3._4_4_ = uVar7 + curr_3._4_4_;
  }
  if (bVar5) {
    if (local_78 < 2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar10 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                         ,0x925,"(numItems > 1)","numItems > 1");
      if (!bVar5) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar10 = 0;
    }
    uVar7 = CharSet<char16_t>::Count((this->super_Node).firstSet);
    if (curr_3._4_4_ == uVar7) {
      if (bVar2) {
        this->scheme = Set;
      }
      else if ((bVar3) && (curr_3._4_4_ < 0x19)) {
        this->scheme = Switch;
        this->switchSize = curr_3._4_4_;
      }
      else {
        this->scheme = Chain;
      }
      this->isOptional = false;
      return;
    }
  }
  bVar5 = false;
  bVar2 = true;
  bVar3 = true;
  local_90 = 0;
  curr_4._4_4_ = 0;
  for (unionSet.rep._32_8_ = this; unionSet.rep._32_8_ != 0;
      unionSet.rep._32_8_ = *(undefined8 *)(unionSet.rep._32_8_ + 0x40)) {
    bVar6 = Node::IsEmptyOnly(*(Node **)(unionSet.rep._32_8_ + 0x38));
    if (bVar6) {
      bVar5 = true;
    }
    else {
      bVar6 = CountDomain::CouldMatchEmpty
                        ((CountDomain *)(*(long *)(unionSet.rep._32_8_ + 0x38) + 0x28));
      if (bVar6) {
        bVar5 = false;
        break;
      }
      local_90 = local_90 + 1;
      bVar6 = Node::IsSimpleOneChar(*(Node **)(unionSet.rep._32_8_ + 0x38));
      if (!bVar6) {
        bVar2 = false;
      }
      bVar6 = CharSet<char16_t>::IsCompact
                        (*(CharSet<char16_t> **)(*(long *)(unionSet.rep._32_8_ + 0x38) + 0x10));
      if (!bVar6) {
        bVar3 = false;
      }
      uVar7 = CharSet<char16_t>::Count
                        (*(CharSet<char16_t> **)(*(long *)(unionSet.rep._32_8_ + 0x38) + 0x10));
      curr_4._4_4_ = uVar7 + curr_4._4_4_;
    }
  }
  if (bVar5) {
    bVar5 = false;
    if ((local_90 == 0) ||
       ((((*(uint *)&(this->super_Node).field_0xc >> 2 & 1) != 0 && (bVar2)) &&
        (uVar7 = CharSet<char16_t>::Count((this->super_Node).firstSet), curr_4._4_4_ == uVar7)))) {
      bVar5 = true;
    }
    else {
      bVar6 = CountDomain::CouldMatchEmpty(&(this->super_Node).followConsumes);
      if (!bVar6) {
        CharSet<char16_t>::CharSet((CharSet<char16_t> *)local_c8);
        CharSet<char16_t>::UnionInPlace
                  ((CharSet<char16_t> *)local_c8,pCStack_18->ctAllocator,(this->super_Node).firstSet
                  );
        CharSet<char16_t>::UnionInPlace
                  ((CharSet<char16_t> *)local_c8,pCStack_18->ctAllocator,
                   (this->super_Node).followSet);
        uVar7 = CharSet<char16_t>::Count((this->super_Node).followSet);
        uVar8 = CharSet<char16_t>::Count((CharSet<char16_t> *)local_c8);
        bVar5 = curr_4._4_4_ + uVar7 == uVar8;
      }
    }
    if (bVar5) {
      if (local_90 == 0) {
        this->scheme = None;
      }
      else if (bVar2) {
        this->scheme = Set;
      }
      else if (((local_90 < 2) || (!bVar3)) || (0x18 < curr_4._4_4_)) {
        this->scheme = Chain;
      }
      else {
        this->switchSize = curr_4._4_4_;
        this->scheme = Switch;
      }
      this->isOptional = true;
      return;
    }
  }
  bVar5 = true;
  for (pAStack_d8 = this; pAStack_d8 != (AltNode *)0x0; pAStack_d8 = pAStack_d8->tail) {
    trie._20_4_ = 1;
    uVar9 = (*pAStack_d8->head->_vptr_Node[0x14])(pAStack_d8->head,pCStack_18,&trie.field_0x14);
    if ((uVar9 & 1) == 0) {
      bVar5 = false;
      break;
    }
    if (0x10 < (uint)trie._20_4_) {
      bVar5 = false;
      break;
    }
  }
  if (bVar5) {
    CharTrie::CharTrie((CharTrie *)&curr_6);
    for (local_100 = this; local_100 != (AltNode *)0x0; local_100 = local_100->tail) {
      uVar9 = (*local_100->head->_vptr_Node[0x15])
                        (local_100->head,pCStack_18,&curr_6,0,
                         (ulong)(*(uint *)&(this->super_Node).field_0xc >> 2 & 1));
      if ((uVar9 & 1) == 0) {
        bVar5 = false;
        break;
      }
    }
    if (bVar5) {
      bVar5 = CharTrie::IsDepthZero((CharTrie *)&curr_6);
      if (bVar5) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar10 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                           ,0x9e1,"(!trie.IsDepthZero())","!trie.IsDepthZero()");
        if (!bVar5) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar10 = 0;
      }
      bVar5 = CharTrie::IsDepthOne((CharTrie *)&curr_6);
      if (!bVar5) {
        pAVar11 = &pCStack_18->ctAllocator->
                   super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
        Memory::TrackAllocData::CreateTrackAllocData
                  (&local_128,(type_info *)&RuntimeCharTrie::typeinfo,0,0xffffffffffffffff,
                   "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                   ,0x9ed);
        pAVar11 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                  TrackAllocInfo(pAVar11,&local_128);
        this_02 = (RuntimeCharTrie *)
                  new<Memory::ArenaAllocator>(0x10,(ArenaAllocator *)pAVar11,0x3f67b0);
        RuntimeCharTrie::RuntimeCharTrie(this_02);
        this->runtimeTrie = this_02;
        RuntimeCharTrie::CloneFrom
                  (this->runtimeTrie,pCStack_18->scriptContext,pCStack_18->rtAllocator,
                   (CharTrie *)&curr_6);
        this->scheme = Trie;
        return;
      }
      this->isOptional = false;
      this->scheme = Set;
      return;
    }
  }
  this->scheme = Try;
  *(uint *)&(this->super_Node).field_0xc = *(uint *)&(this->super_Node).field_0xc & 0xfffffdff;
  return;
}

Assistant:

void AltNode::AnnotatePass4(Compiler& compiler)
    {
        PROBE_STACK_NO_DISPOSE(compiler.scriptContext, Js::Constants::MinStackRegex);

        //
        // Simplification rule
        //
        // If the follow is irrefutable then we can ignore all items after an irrefutable item, since
        // we'll never be able to backtrack into them.
        // E.g.: (a*|b*)c* === a*c*
        //

        bool simplified = false;
        if (isFollowIrrefutable && isThisIrrefutable)
        {
            for (AltNode* curr = this; curr != 0; curr = curr->tail)
            {
                if (curr->head->isThisIrrefutable && curr->tail != 0)
                {
                    curr->tail = 0;
                    simplified = true;
                    break;
                }
            }
        }

        if (simplified)
        {
            Assert(!isFirstExact);
            // Recalculate firstSet. Since it can only get smaller, and alternative could not have had an exact
            // first set, this recalculation does not make any decisions already made based on the current firstSet
            // unsound.
            // NOTE: Is it worth recalculating the WillNotProgress/WillNotRegress bools?
            firstSet = Anew(compiler.ctAllocator, UnicodeCharSet);
            for (AltNode* curr = this; curr != 0; curr = curr->tail)
                firstSet->UnionInPlace(compiler.ctAllocator, *curr->head->firstSet);
        }

        //
        // Annotate items
        //
        isDeterministic = true;
        for (AltNode* curr = this; curr != 0; curr = curr->tail)
        {
            curr->head->AnnotatePass4(compiler);
            if (!curr->head->isDeterministic)
                isDeterministic = false;
        }

        //
        // Compilation scheme: Switch/Chain/Set, not isOptional
        //
        // If no item can match empty and all items' FIRST sets are pairwise disjoint then we can
        // commit to an item using a 1 char lookahead. We can fall-through to the last
        // item without guarding it since it will fail if the next character cannot match.
        // E.g.: (abc|def)
        //

        {
            // Pass 1: Items cannot match empty, accumulate counts
            bool fires = true;
            bool allCompact = true;
            bool allSimpleOneChar = true;
            int numItems = 0;
            uint totalChars = 0;
            for (AltNode* curr = this; curr != 0; curr = curr->tail)
            {
                if (curr->head->thisConsumes.CouldMatchEmpty())
                {
                    fires = false;
                    break;
                }
                numItems++;
                if (!curr->head->firstSet->IsCompact())
                {
                    allCompact = false;
                }
                if (!curr->head->IsSimpleOneChar())
                {
                    allSimpleOneChar = false;
                }
                totalChars += curr->head->firstSet->Count();
            }

            if (fires)
            {
                // To go from two to one items requires the first item
                // to be irrefutable, in which case it could match empty and this rule won't fire.
                Assert(numItems > 1);
                // Step 2: Check FIRST sets are disjoint
                if (totalChars == firstSet->Count())
                {
                    // **COMMIT**
                    if (allSimpleOneChar)
                    {
                        // This will probably never fire since the parser has already converted alts-of-chars/sets
                        // to sets. We include it for symmetry with below.
                        scheme = Set;
                    }
                    else if (allCompact && totalChars <= Switch24Inst::MaxCases)
                    {
                        // Can use a switch instruction to jump to item
                        scheme = Switch;
                        switchSize = totalChars;
                    }
                    else
                    {
                        // Must use a chain of jump instructions to jump to item
                        scheme = Chain;
                    }
                    isOptional = false;
                    return;
                }
            }
        }

        //
        // Compilation scheme: None/Switch/Chain/Set, isOptional
        //
        // Condition (1):
        // If some items are empty-only, the rest (if any) cannot match empty, follow cannot match empty, and
        // all items' FIRST sets are pairwise disjoint and disjoint from the FOLLOW set, then we can commit to
        // either a non-empty item or to the empty item using a 1 char lookahead. In this case we just emit each
        // non-empty item with a guard, and fall-through to follow if no guard fires.
        // E.g.: (abc||def)h
        //
        // Condition (2):
        // If some items are empty-only, the rest (if any) cannot match empty, follow is irrefutable, and all
        // items' FIRST sets are pairwise disjoint, then we can commit to either a non-empty item or to the empty
        // item using a 1 char lookahead, provided each non-empty item obeys the condition:
        //   ** the item can't fail if given an arbitrary input starting with a character in its FIRST set **
        // Currently, we can prove that only for IsSimpleOneChar items, though more analysis could widen the class.
        // Again, we emit each non-empty item with a guard, and fall-through to follow if no guard fires.
        // E.g.: ([abc]|)a*
        //
        // Condition (3):
        // If all items are empty-only, we can commit to a single empty-only item

        {
            // Pass 1
            bool fires = false;
            bool allSimpleOneChar = true;
            bool allCompact = true;
            int numNonEmpty = 0;
            uint totalChars = 0;
            for (AltNode* curr = this; curr != 0; curr = curr->tail)
            {
                if (curr->head->IsEmptyOnly())
                {
                    fires = true;
                }
                else if (curr->head->thisConsumes.CouldMatchEmpty())
                {
                    fires = false;
                    break;
                }
                else
                {
                    numNonEmpty++;
                    if (!curr->head->IsSimpleOneChar())
                    {
                        allSimpleOneChar = false;
                    }
                    if (!curr->head->firstSet->IsCompact())
                    {
                        allCompact = false;
                    }
                    totalChars += curr->head->firstSet->Count();
                }
            }

            if (fires)
            {
                // The firing condition is not strong enough yet.
                fires = false;
                // Check conditions (2) and (3) first because they're faster, then check condition (1).
                if (numNonEmpty == 0 ||
                    (isFollowIrrefutable && allSimpleOneChar && totalChars == firstSet->Count()))
                {
                    fires = true;
                }
                else if (!followConsumes.CouldMatchEmpty())
                {
                    // Check whether all FIRST sets are pairwise disjoint
                    // and disjoint from the FOLLOW set.
                    CharSet<Char> unionSet;
                    unionSet.UnionInPlace(compiler.ctAllocator, *firstSet);
                    unionSet.UnionInPlace(compiler.ctAllocator, *followSet);
                    if (totalChars + followSet->Count() == unionSet.Count())
                    {
                        fires = true;
                    }
                }

                if (fires)
                {
                    // **COMMIT**
                    if (numNonEmpty == 0)
                    {
                        scheme = None;
                    }
                    else if (allSimpleOneChar)
                    {
                        scheme = Set;
                    }
                    else if (numNonEmpty > 1 && allCompact && totalChars <= Switch24Inst::MaxCases)
                    {
                        switchSize = totalChars;
                        scheme = Switch;
                    }
                    else
                    {
                        scheme = Chain;
                    }
                    isOptional = true;
                    return;
                }
            }
        }

        //
        // Compilation scheme: Trie
        //
        // If alt is equivalent to the form:
        //   (literal1|...|literaln)
        // (we expand items with embedded character classes such as a[bc]d to (abd|acd)) and either:
        //  - follow is irrefutable and no later literal is a proper prefix of an earlier literal
        //    (and we may ignore later literals which have an earlier literal as proper prefix)
        //    E.g.: (ab|ac|abd)a* === (ab|ac)a*
        // or:
        //  - follow is not irrefutable and no literal is a proper prefix of any other literal
        //    and the branching factor of the resulting trie is smallish
        //    E.g.: (abc|abd|abe)f
        // then we can use a character trie to match the appropriate item.
        //

        {
            // Pass 1: Items must be structurally appropriate and not result in too many alternatives after expansion
            bool fires = true;
            for (AltNode* curr = this; curr != 0; curr = curr->tail)
            {
                uint numAlts = 1;
                if (!curr->head->IsCharTrieArm(compiler, numAlts))
                {
                    fires = false;
                    break;
                }
                if (numAlts > maxTrieArmExpansion)
                {
                    fires = false;
                    break;
                }
            }

            if (fires)
            {
                // Pass 2: Attempt to construct the trie, checking for prefixes.
                CharTrie trie;
                for (AltNode* curr = this; curr != 0; curr = curr->tail)
                {
                    if (!curr->head->BuildCharTrie(compiler, &trie, 0, isFollowIrrefutable))
                    {
                        fires = false;
                        break;
                    }
                }

                if (fires)
                {
                    // **COMMIT**
                    // If follow is irrefutable and first item is empty, the trie would be of depth zero.
                    // However, in this case, the first simplification rule would have replaced the alt with a
                    // single empty item, and the 'None' compilation scheme would have been selected above.
                    //
                    // Similarly, if all alternations are empty and follow is refutable, the trie would be
                    // of depth zero, and the 'None' compilation scheme would have been selected above.
                    Assert(!trie.IsDepthZero());
                    if (trie.IsDepthOne())
                    {
                        // This case will fire if follow is irrefutable and all non length one items have an
                        // earlier one-character item as prefix. In this case we don't need the trie: the
                        // firstSet has all the information.
                        isOptional = false;
                        scheme = Set;
                    }
                    else
                    {
                        // Root of trie will live in compile-time allocator, but body will be in run-time allocator
                        runtimeTrie = Anew(compiler.ctAllocator, RuntimeCharTrie);
                        runtimeTrie->CloneFrom(compiler.scriptContext, compiler.rtAllocator, trie);
                        scheme = Trie;
                    }
                    return;
                }
            }
        }

        //
        // Compilation scheme: Try
        //

        scheme = Try;
        isDeterministic = false; // NON-DETERMINISTIC
    }